

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 uVar2;
  uint uVar3;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  size_t k;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  undefined4 uVar32;
  long lVar33;
  uint uVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  ulong uVar36;
  ulong uVar37;
  NodeRef *pNVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar64;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [64];
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar165;
  undefined1 auVar161 [16];
  float fVar163;
  float fVar164;
  undefined1 auVar162 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [64];
  float fVar170;
  float fVar173;
  float fVar174;
  undefined1 auVar171 [16];
  float fVar175;
  undefined1 auVar172 [16];
  Precalculations pre;
  undefined1 local_38b8 [8];
  float fStack_38b0;
  undefined4 uStack_38ac;
  float local_3878;
  float fStack_3874;
  float fStack_3870;
  undefined1 local_3868 [16];
  undefined1 local_3858 [16];
  undefined1 local_3848 [16];
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_37e8 [16];
  undefined1 local_37d8 [16];
  undefined8 local_3708;
  undefined8 uStack_3700;
  RTCHitN local_36f8 [16];
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  undefined1 local_36c8 [16];
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  undefined1 local_3698 [16];
  uint local_3688;
  uint uStack_3684;
  uint uStack_3680;
  uint uStack_367c;
  uint uStack_3678;
  uint uStack_3674;
  uint uStack_3670;
  uint uStack_366c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar149 [16];
  
  auVar10 = mm_lookupmask_ps._240_16_;
  uVar27 = mm_lookupmask_ps._8_8_;
  uVar26 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar105 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar63 = vpcmpeqd_avx(auVar105,(undefined1  [16])valid_i->field_0);
    auVar80 = ZEXT816(0) << 0x40;
    auVar81 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar80,5);
    auVar75 = auVar63 & auVar81;
    if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar75[0xf] < '\0')
    {
      auVar81 = vandps_avx(auVar81,auVar63);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar149._8_4_ = 0x7fffffff;
      auVar149._0_8_ = 0x7fffffff7fffffff;
      auVar149._12_4_ = 0x7fffffff;
      auVar150 = ZEXT1664(auVar149);
      auVar63 = vandps_avx(auVar149,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar139._8_4_ = 0x219392ef;
      auVar139._0_8_ = 0x219392ef219392ef;
      auVar139._12_4_ = 0x219392ef;
      auVar75 = vcmpps_avx(auVar63,auVar139,1);
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = &DAT_3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar92 = vdivps_avx(auVar151,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar63 = vandps_avx(auVar149,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar91 = vcmpps_avx(auVar63,auVar139,1);
      auVar76 = vdivps_avx(auVar151,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar63 = vandps_avx(auVar149,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar63 = vcmpps_avx(auVar63,auVar139,1);
      auVar123 = vdivps_avx(auVar151,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar140._8_4_ = 0x5d5e0b6b;
      auVar140._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar140._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar92,auVar140,auVar75);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar76,auVar140,auVar91);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar123,auVar140,auVar63)
      ;
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar80,1);
      auVar92._8_4_ = 0x20;
      auVar92._0_8_ = 0x2000000020;
      auVar92._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar63,auVar92);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar80,5);
      auVar75._8_4_ = 0x40;
      auVar75._0_8_ = 0x4000000040;
      auVar75._12_4_ = 0x40;
      auVar76._8_4_ = 0x60;
      auVar76._0_8_ = 0x6000000060;
      auVar76._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar76,auVar75,auVar63);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar80,5);
      auVar91._8_4_ = 0x80;
      auVar91._0_8_ = 0x8000000080;
      auVar91._12_4_ = 0x80;
      auVar123._8_4_ = 0xa0;
      auVar123._0_8_ = 0xa0000000a0;
      auVar123._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar123,auVar91,auVar63)
      ;
      auVar63 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar80);
      auVar75 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar80);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar157 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar63,auVar81);
      auVar82 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar63._8_4_ = 0xff800000;
      auVar63._0_8_ = 0xff800000ff800000;
      auVar63._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar63,auVar75,auVar81);
      terminated.field_0.i[1] = auVar81._4_4_ ^ auVar105._4_4_;
      terminated.field_0.i[0] = auVar81._0_4_ ^ auVar105._0_4_;
      terminated.field_0.i[2] = auVar81._8_4_ ^ auVar105._8_4_;
      terminated.field_0.i[3] = auVar81._12_4_ ^ auVar105._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar35 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_0062ce3d:
      paVar35 = paVar35 + -1;
      root.ptr = pNVar38[-1].ptr;
      pNVar38 = pNVar38 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0062e06f;
      aVar166 = *paVar35;
      auVar105 = vcmpps_avx((undefined1  [16])aVar166,(undefined1  [16])tray.tfar.field_0,1);
      uVar28 = vmovmskps_avx(auVar105);
      if (uVar28 == 0) {
        iVar29 = 2;
      }
      else {
        uVar37 = (ulong)(uVar28 & 0xff);
        uVar28 = POPCOUNT(uVar28 & 0xff);
        iVar29 = 0;
        if (uVar28 <= uVar34) {
          local_3848 = auVar150._0_16_;
          do {
            k = 0;
            for (uVar31 = uVar37; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar82 = ZEXT1664(auVar82._0_16_);
            bVar39 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar39) {
              terminated.field_0.i[k] = -1;
            }
            uVar37 = uVar37 - 1 & uVar37;
          } while (uVar37 != 0);
          auVar105 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
          iVar29 = 3;
          auVar150 = ZEXT1664(local_3848);
          auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar105[0xf] < '\0') {
            auVar82 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar105._8_4_ = 0xff800000;
            auVar105._0_8_ = 0xff800000ff800000;
            auVar105._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar105,
                               (undefined1  [16])terminated.field_0);
            iVar29 = 2;
          }
        }
        if (uVar34 < uVar28) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0062e06f;
              auVar105 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar166,6)
              ;
              if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar105[0xf] < '\0') {
                uVar37 = (ulong)((uint)root.ptr & 0xf);
                if (uVar37 == 8) {
                  auVar105 = vpcmpeqd_avx(auVar82._0_16_,auVar82._0_16_);
                  aVar64 = terminated.field_0;
                  goto LAB_0062e02c;
                }
                auVar80._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                auVar80._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                auVar80._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                lVar33 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar31 = 0;
                local_3848 = auVar150._0_16_;
                goto LAB_0062d091;
              }
              iVar29 = 2;
              break;
            }
            auVar169 = ZEXT1664(auVar157._0_16_);
            uVar37 = 0;
            uVar31 = 8;
            do {
              uVar36 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar37 * 8);
              if (uVar36 != 8) {
                uVar32 = *(undefined4 *)(root.ptr + 0x40 + uVar37 * 4);
                auVar40._4_4_ = uVar32;
                auVar40._0_4_ = uVar32;
                auVar40._8_4_ = uVar32;
                auVar40._12_4_ = uVar32;
                auVar19._8_8_ = tray.org.field_0._8_8_;
                auVar19._0_8_ = tray.org.field_0._0_8_;
                auVar20._8_8_ = tray.org.field_0._24_8_;
                auVar20._0_8_ = tray.org.field_0._16_8_;
                auVar21._8_8_ = tray.org.field_0._40_8_;
                auVar21._0_8_ = tray.org.field_0._32_8_;
                auVar105 = vsubps_avx(auVar40,auVar19);
                auVar120._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar105._0_4_;
                auVar120._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar105._4_4_;
                auVar120._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar105._8_4_;
                auVar120._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar105._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0x80 + uVar37 * 4);
                auVar41._4_4_ = uVar32;
                auVar41._0_4_ = uVar32;
                auVar41._8_4_ = uVar32;
                auVar41._12_4_ = uVar32;
                auVar105 = vsubps_avx(auVar41,auVar20);
                auVar127._0_4_ = tray.rdir.field_0._16_4_ * auVar105._0_4_;
                auVar127._4_4_ = tray.rdir.field_0._20_4_ * auVar105._4_4_;
                auVar127._8_4_ = tray.rdir.field_0._24_4_ * auVar105._8_4_;
                auVar127._12_4_ = tray.rdir.field_0._28_4_ * auVar105._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xc0 + uVar37 * 4);
                auVar42._4_4_ = uVar32;
                auVar42._0_4_ = uVar32;
                auVar42._8_4_ = uVar32;
                auVar42._12_4_ = uVar32;
                auVar105 = vsubps_avx(auVar42,auVar21);
                auVar141._0_4_ = tray.rdir.field_0._32_4_ * auVar105._0_4_;
                auVar141._4_4_ = tray.rdir.field_0._36_4_ * auVar105._4_4_;
                auVar141._8_4_ = tray.rdir.field_0._40_4_ * auVar105._8_4_;
                auVar141._12_4_ = tray.rdir.field_0._44_4_ * auVar105._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0x60 + uVar37 * 4);
                auVar43._4_4_ = uVar32;
                auVar43._0_4_ = uVar32;
                auVar43._8_4_ = uVar32;
                auVar43._12_4_ = uVar32;
                auVar105 = vsubps_avx(auVar43,auVar19);
                auVar65._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar105._0_4_;
                auVar65._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar105._4_4_;
                auVar65._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar105._8_4_;
                auVar65._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar105._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xa0 + uVar37 * 4);
                auVar44._4_4_ = uVar32;
                auVar44._0_4_ = uVar32;
                auVar44._8_4_ = uVar32;
                auVar44._12_4_ = uVar32;
                auVar105 = vsubps_avx(auVar44,auVar20);
                auVar83._0_4_ = tray.rdir.field_0._16_4_ * auVar105._0_4_;
                auVar83._4_4_ = tray.rdir.field_0._20_4_ * auVar105._4_4_;
                auVar83._8_4_ = tray.rdir.field_0._24_4_ * auVar105._8_4_;
                auVar83._12_4_ = tray.rdir.field_0._28_4_ * auVar105._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xe0 + uVar37 * 4);
                auVar45._4_4_ = uVar32;
                auVar45._0_4_ = uVar32;
                auVar45._8_4_ = uVar32;
                auVar45._12_4_ = uVar32;
                auVar105 = vsubps_avx(auVar45,auVar21);
                auVar106._0_4_ = tray.rdir.field_0._32_4_ * auVar105._0_4_;
                auVar106._4_4_ = tray.rdir.field_0._36_4_ * auVar105._4_4_;
                auVar106._8_4_ = tray.rdir.field_0._40_4_ * auVar105._8_4_;
                auVar106._12_4_ = tray.rdir.field_0._44_4_ * auVar105._12_4_;
                auVar105 = vminps_avx(auVar120,auVar65);
                auVar63 = vminps_avx(auVar127,auVar83);
                auVar105 = vmaxps_avx(auVar105,auVar63);
                auVar63 = vminps_avx(auVar141,auVar106);
                auVar105 = vmaxps_avx(auVar105,auVar63);
                auVar46._0_4_ = auVar148._0_4_ * auVar105._0_4_;
                auVar46._4_4_ = auVar148._4_4_ * auVar105._4_4_;
                auVar46._8_4_ = auVar148._8_4_ * auVar105._8_4_;
                auVar46._12_4_ = auVar148._12_4_ * auVar105._12_4_;
                auVar105 = vmaxps_avx(auVar120,auVar65);
                auVar63 = vmaxps_avx(auVar127,auVar83);
                auVar63 = vminps_avx(auVar105,auVar63);
                auVar105 = vmaxps_avx(auVar141,auVar106);
                auVar105 = vminps_avx(auVar63,auVar105);
                auVar66._0_4_ = auVar162._0_4_ * auVar105._0_4_;
                auVar66._4_4_ = auVar162._4_4_ * auVar105._4_4_;
                auVar66._8_4_ = auVar162._8_4_ * auVar105._8_4_;
                auVar66._12_4_ = auVar162._12_4_ * auVar105._12_4_;
                auVar105 = vmaxps_avx(auVar46,(undefined1  [16])tray.tnear.field_0);
                auVar63 = vminps_avx(auVar66,(undefined1  [16])tray.tfar.field_0);
                auVar105 = vcmpps_avx(auVar105,auVar63,2);
                auVar82 = ZEXT1664(auVar105);
                if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar105[0xf] < '\0') {
                  auVar105 = vblendvps_avx(auVar157._0_16_,auVar46,auVar105);
                  if (uVar31 != 8) {
                    pNVar38->ptr = uVar31;
                    pNVar38 = pNVar38 + 1;
                    *paVar35 = auVar169._0_16_;
                    paVar35 = paVar35 + 1;
                  }
                  auVar169 = ZEXT1664(auVar105);
                  uVar31 = uVar36;
                }
              }
              aVar166 = auVar169._0_16_;
            } while ((uVar36 != 8) && (bVar39 = uVar37 < 7, uVar37 = uVar37 + 1, bVar39));
            iVar29 = 0;
            if (uVar31 == 8) {
LAB_0062d02b:
              bVar39 = false;
              iVar29 = 4;
            }
            else {
              auVar105 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar166,6)
              ;
              uVar32 = vmovmskps_avx(auVar105);
              bVar39 = true;
              if ((uint)POPCOUNT(uVar32) <= uVar34) {
                pNVar38->ptr = uVar31;
                pNVar38 = pNVar38 + 1;
                *paVar35 = aVar166;
                paVar35 = paVar35 + 1;
                goto LAB_0062d02b;
              }
            }
            root.ptr = uVar31;
          } while (bVar39);
        }
      }
      goto LAB_0062e072;
    }
  }
  return;
  while( true ) {
    uVar31 = uVar31 + 1;
    lVar33 = lVar33 + 0xe0;
    auVar63 = auVar80;
    if (uVar37 - 8 <= uVar31) break;
LAB_0062d091:
    lVar30 = uVar31 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar82 = ZEXT1664(auVar80);
    uVar36 = 0;
    local_3858 = auVar80;
    while( true ) {
      auVar105 = auVar82._0_16_;
      uVar28 = *(uint *)(lVar33 + uVar36 * 4);
      if ((ulong)uVar28 == 0xffffffff) break;
      uVar32 = *(undefined4 *)(lVar33 + -0xc0 + uVar36 * 4);
      auVar47._4_4_ = uVar32;
      auVar47._0_4_ = uVar32;
      auVar47._8_4_ = uVar32;
      auVar47._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar33 + -0xb0 + uVar36 * 4);
      auVar84._4_4_ = uVar32;
      auVar84._0_4_ = uVar32;
      auVar84._8_4_ = uVar32;
      auVar84._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar33 + -0xa0 + uVar36 * 4);
      auVar159._4_4_ = uVar32;
      auVar159._0_4_ = uVar32;
      auVar159._8_4_ = uVar32;
      auVar159._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar33 + -0x90 + uVar36 * 4);
      auVar121._4_4_ = uVar32;
      auVar121._0_4_ = uVar32;
      auVar121._8_4_ = uVar32;
      auVar121._12_4_ = uVar32;
      local_38b8._4_4_ = *(undefined4 *)(lVar33 + -0x80 + uVar36 * 4);
      local_38b8._0_4_ = local_38b8._4_4_;
      fStack_38b0 = (float)local_38b8._4_4_;
      uStack_38ac = local_38b8._4_4_;
      uVar32 = *(undefined4 *)(lVar33 + -0x70 + uVar36 * 4);
      auVar171._4_4_ = uVar32;
      auVar171._0_4_ = uVar32;
      auVar171._8_4_ = uVar32;
      auVar171._12_4_ = uVar32;
      local_37d8._4_4_ = *(undefined4 *)(lVar33 + -0x60 + uVar36 * 4);
      local_37d8._0_4_ = local_37d8._4_4_;
      local_37d8._8_4_ = local_37d8._4_4_;
      local_37d8._12_4_ = local_37d8._4_4_;
      local_37e8._4_4_ = *(undefined4 *)(lVar33 + -0x50 + uVar36 * 4);
      local_37e8._0_4_ = local_37e8._4_4_;
      local_37e8._8_4_ = local_37e8._4_4_;
      local_37e8._12_4_ = local_37e8._4_4_;
      uVar32 = *(undefined4 *)(lVar33 + -0x40 + uVar36 * 4);
      uVar2 = *(undefined4 *)(lVar33 + -0x30 + uVar36 * 4);
      auVar134._4_4_ = uVar2;
      auVar134._0_4_ = uVar2;
      auVar134._8_4_ = uVar2;
      auVar134._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar33 + -0x20 + uVar36 * 4);
      auVar145._4_4_ = uVar2;
      auVar145._0_4_ = uVar2;
      auVar145._8_4_ = uVar2;
      auVar145._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar33 + -0x10 + uVar36 * 4);
      auVar152._4_4_ = uVar2;
      auVar152._0_4_ = uVar2;
      auVar152._8_4_ = uVar2;
      auVar152._12_4_ = uVar2;
      local_3708 = *(undefined8 *)(lVar30 + 0xd0);
      uStack_3700 = *(undefined8 *)(lVar30 + 0xd8);
      auVar63 = *(undefined1 (*) [16])ray;
      auVar75 = *(undefined1 (*) [16])(ray + 0x10);
      auVar80 = *(undefined1 (*) [16])(ray + 0x20);
      auVar76 = vsubps_avx(auVar47,auVar63);
      auVar123 = vsubps_avx(auVar84,auVar75);
      auVar139 = vsubps_avx(auVar159,auVar80);
      auVar140 = vsubps_avx(auVar145,auVar75);
      auVar149 = vsubps_avx(auVar152,auVar80);
      auVar151 = vsubps_avx(auVar140,auVar123);
      auVar47 = vsubps_avx(auVar149,auVar139);
      auVar146._0_4_ = auVar140._0_4_ + auVar123._0_4_;
      auVar146._4_4_ = auVar140._4_4_ + auVar123._4_4_;
      auVar146._8_4_ = auVar140._8_4_ + auVar123._8_4_;
      auVar146._12_4_ = auVar140._12_4_ + auVar123._12_4_;
      fVar6 = auVar139._0_4_;
      auVar153._0_4_ = auVar149._0_4_ + fVar6;
      fVar7 = auVar139._4_4_;
      auVar153._4_4_ = auVar149._4_4_ + fVar7;
      fVar8 = auVar139._8_4_;
      auVar153._8_4_ = auVar149._8_4_ + fVar8;
      fVar9 = auVar139._12_4_;
      auVar153._12_4_ = auVar149._12_4_ + fVar9;
      auVar160._0_4_ = auVar146._0_4_ * auVar47._0_4_;
      auVar160._4_4_ = auVar146._4_4_ * auVar47._4_4_;
      auVar160._8_4_ = auVar146._8_4_ * auVar47._8_4_;
      auVar160._12_4_ = auVar146._12_4_ * auVar47._12_4_;
      auVar122 = vfmsub231ps_fma(auVar160,auVar151,auVar153);
      auVar84 = vsubps_avx(auVar134,auVar63);
      auVar159 = vsubps_avx(auVar84,auVar76);
      auVar154._0_4_ = auVar153._0_4_ * auVar159._0_4_;
      auVar154._4_4_ = auVar153._4_4_ * auVar159._4_4_;
      auVar154._8_4_ = auVar153._8_4_ * auVar159._8_4_;
      auVar154._12_4_ = auVar153._12_4_ * auVar159._12_4_;
      auVar167._0_4_ = auVar84._0_4_ + auVar76._0_4_;
      auVar167._4_4_ = auVar84._4_4_ + auVar76._4_4_;
      auVar167._8_4_ = auVar84._8_4_ + auVar76._8_4_;
      auVar167._12_4_ = auVar84._12_4_ + auVar76._12_4_;
      auVar92 = vfmsub231ps_fma(auVar154,auVar47,auVar167);
      auVar168._0_4_ = auVar167._0_4_ * auVar151._0_4_;
      auVar168._4_4_ = auVar167._4_4_ * auVar151._4_4_;
      auVar168._8_4_ = auVar167._8_4_ * auVar151._8_4_;
      auVar168._12_4_ = auVar167._12_4_ * auVar151._12_4_;
      auVar91 = vfmsub231ps_fma(auVar168,auVar159,auVar146);
      fVar15 = *(float *)(ray + 0x60);
      fVar16 = *(float *)(ray + 100);
      fVar17 = *(float *)(ray + 0x68);
      auVar24 = *(undefined1 (*) [12])(ray + 0x60);
      fVar18 = *(float *)(ray + 0x6c);
      auVar135._0_4_ = auVar91._0_4_ * fVar15;
      auVar135._4_4_ = auVar91._4_4_ * fVar16;
      auVar135._8_4_ = auVar91._8_4_ * fVar17;
      auVar135._12_4_ = auVar91._12_4_ * fVar18;
      auVar91 = *(undefined1 (*) [16])(ray + 0x50);
      auVar135 = vfmadd231ps_fma(auVar135,auVar91,auVar92);
      auVar92 = *(undefined1 (*) [16])(ray + 0x40);
      auVar146 = vfmadd231ps_fma(auVar135,auVar92,auVar122);
      auVar63 = vsubps_avx(auVar121,auVar63);
      auVar75 = vsubps_avx(_local_38b8,auVar75);
      auVar80 = vsubps_avx(auVar171,auVar80);
      auVar135 = vsubps_avx(auVar123,auVar75);
      auVar139 = vsubps_avx(auVar139,auVar80);
      auVar124._0_4_ = auVar123._0_4_ + auVar75._0_4_;
      auVar124._4_4_ = auVar123._4_4_ + auVar75._4_4_;
      auVar124._8_4_ = auVar123._8_4_ + auVar75._8_4_;
      auVar124._12_4_ = auVar123._12_4_ + auVar75._12_4_;
      auVar142._0_4_ = fVar6 + auVar80._0_4_;
      auVar142._4_4_ = fVar7 + auVar80._4_4_;
      auVar142._8_4_ = fVar8 + auVar80._8_4_;
      auVar142._12_4_ = fVar9 + auVar80._12_4_;
      fVar170 = auVar139._0_4_;
      auVar122._0_4_ = fVar170 * auVar124._0_4_;
      fVar173 = auVar139._4_4_;
      auVar122._4_4_ = fVar173 * auVar124._4_4_;
      fVar174 = auVar139._8_4_;
      auVar122._8_4_ = fVar174 * auVar124._8_4_;
      fVar175 = auVar139._12_4_;
      auVar122._12_4_ = fVar175 * auVar124._12_4_;
      auVar153 = vfmsub231ps_fma(auVar122,auVar135,auVar142);
      auVar122 = vsubps_avx(auVar76,auVar63);
      fVar11 = auVar122._0_4_;
      auVar143._0_4_ = auVar142._0_4_ * fVar11;
      fVar12 = auVar122._4_4_;
      auVar143._4_4_ = auVar142._4_4_ * fVar12;
      fVar13 = auVar122._8_4_;
      auVar143._8_4_ = auVar142._8_4_ * fVar13;
      fVar14 = auVar122._12_4_;
      auVar143._12_4_ = auVar142._12_4_ * fVar14;
      auVar128._0_4_ = auVar76._0_4_ + auVar63._0_4_;
      auVar128._4_4_ = auVar76._4_4_ + auVar63._4_4_;
      auVar128._8_4_ = auVar76._8_4_ + auVar63._8_4_;
      auVar128._12_4_ = auVar76._12_4_ + auVar63._12_4_;
      auVar142 = vfmsub231ps_fma(auVar143,auVar139,auVar128);
      fVar158 = auVar135._0_4_;
      auVar129._0_4_ = fVar158 * auVar128._0_4_;
      fVar163 = auVar135._4_4_;
      auVar129._4_4_ = fVar163 * auVar128._4_4_;
      fVar164 = auVar135._8_4_;
      auVar129._8_4_ = fVar164 * auVar128._8_4_;
      fVar165 = auVar135._12_4_;
      auVar129._12_4_ = fVar165 * auVar128._12_4_;
      auVar48 = vfmsub231ps_fma(auVar129,auVar122,auVar124);
      auVar130._0_4_ = fVar15 * auVar48._0_4_;
      auVar130._4_4_ = fVar16 * auVar48._4_4_;
      auVar130._8_4_ = fVar17 * auVar48._8_4_;
      auVar130._12_4_ = fVar18 * auVar48._12_4_;
      auVar142 = vfmadd231ps_fma(auVar130,auVar91,auVar142);
      auVar153 = vfmadd231ps_fma(auVar142,auVar92,auVar153);
      auVar142 = vsubps_avx(auVar63,auVar84);
      auVar48._0_4_ = auVar84._0_4_ + auVar63._0_4_;
      auVar48._4_4_ = auVar84._4_4_ + auVar63._4_4_;
      auVar48._8_4_ = auVar84._8_4_ + auVar63._8_4_;
      auVar48._12_4_ = auVar84._12_4_ + auVar63._12_4_;
      auVar84 = vsubps_avx(auVar75,auVar140);
      auVar67._0_4_ = auVar75._0_4_ + auVar140._0_4_;
      auVar67._4_4_ = auVar75._4_4_ + auVar140._4_4_;
      auVar67._8_4_ = auVar75._8_4_ + auVar140._8_4_;
      auVar67._12_4_ = auVar75._12_4_ + auVar140._12_4_;
      auVar140 = vsubps_avx(auVar80,auVar149);
      auVar85._0_4_ = auVar80._0_4_ + auVar149._0_4_;
      auVar85._4_4_ = auVar80._4_4_ + auVar149._4_4_;
      auVar85._8_4_ = auVar80._8_4_ + auVar149._8_4_;
      auVar85._12_4_ = auVar80._12_4_ + auVar149._12_4_;
      auVar107._0_4_ = auVar140._0_4_ * auVar67._0_4_;
      auVar107._4_4_ = auVar140._4_4_ * auVar67._4_4_;
      auVar107._8_4_ = auVar140._8_4_ * auVar67._8_4_;
      auVar107._12_4_ = auVar140._12_4_ * auVar67._12_4_;
      auVar75 = vfmsub231ps_fma(auVar107,auVar84,auVar85);
      auVar86._0_4_ = auVar142._0_4_ * auVar85._0_4_;
      auVar86._4_4_ = auVar142._4_4_ * auVar85._4_4_;
      auVar86._8_4_ = auVar142._8_4_ * auVar85._8_4_;
      auVar86._12_4_ = auVar142._12_4_ * auVar85._12_4_;
      auVar63 = vfmsub231ps_fma(auVar86,auVar140,auVar48);
      auVar49._0_4_ = auVar48._0_4_ * auVar84._0_4_;
      auVar49._4_4_ = auVar48._4_4_ * auVar84._4_4_;
      auVar49._8_4_ = auVar48._8_4_ * auVar84._8_4_;
      auVar49._12_4_ = auVar48._12_4_ * auVar84._12_4_;
      auVar80 = vfmsub231ps_fma(auVar49,auVar142,auVar67);
      auVar50._0_4_ = fVar15 * auVar80._0_4_;
      auVar50._4_4_ = fVar16 * auVar80._4_4_;
      auVar50._8_4_ = fVar17 * auVar80._8_4_;
      auVar50._12_4_ = fVar18 * auVar80._12_4_;
      auVar63 = vfmadd231ps_fma(auVar50,auVar91,auVar63);
      auVar149 = vfmadd231ps_fma(auVar63,auVar92,auVar75);
      auVar87._0_4_ = auVar149._0_4_ + auVar146._0_4_ + auVar153._0_4_;
      auVar87._4_4_ = auVar149._4_4_ + auVar146._4_4_ + auVar153._4_4_;
      auVar87._8_4_ = auVar149._8_4_ + auVar146._8_4_ + auVar153._8_4_;
      auVar87._12_4_ = auVar149._12_4_ + auVar146._12_4_ + auVar153._12_4_;
      auVar63 = vminps_avx(auVar146,auVar153);
      auVar75 = vminps_avx(auVar63,auVar149);
      auVar63 = vandps_avx(auVar87,local_3848);
      auVar88._0_8_ = CONCAT44(auVar63._4_4_ * 1.1920929e-07,auVar63._0_4_ * 1.1920929e-07);
      auVar88._8_4_ = auVar63._8_4_ * 1.1920929e-07;
      auVar88._12_4_ = auVar63._12_4_ * 1.1920929e-07;
      auVar108._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
      auVar108._8_4_ = -auVar88._8_4_;
      auVar108._12_4_ = -auVar88._12_4_;
      auVar75 = vcmpps_avx(auVar75,auVar108,5);
      auVar80 = vmaxps_avx(auVar146,auVar153);
      auVar80 = vmaxps_avx(auVar80,auVar149);
      auVar80 = vcmpps_avx(auVar80,auVar88,2);
      auVar75 = vorps_avx(auVar75,auVar80);
      auVar80 = auVar105 & auVar75;
      if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar80[0xf])
      {
LAB_0062df39:
        auVar82 = ZEXT1664(auVar105);
        auVar150 = ZEXT1664(local_3848);
        auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar51._0_4_ = fVar158 * auVar47._0_4_;
        auVar51._4_4_ = fVar163 * auVar47._4_4_;
        auVar51._8_4_ = fVar164 * auVar47._8_4_;
        auVar51._12_4_ = fVar165 * auVar47._12_4_;
        auVar68._0_4_ = fVar11 * auVar151._0_4_;
        auVar68._4_4_ = fVar12 * auVar151._4_4_;
        auVar68._8_4_ = fVar13 * auVar151._8_4_;
        auVar68._12_4_ = fVar14 * auVar151._12_4_;
        auVar149 = vfmsub213ps_fma(auVar151,auVar139,auVar51);
        auVar89._0_4_ = fVar170 * auVar84._0_4_;
        auVar89._4_4_ = fVar173 * auVar84._4_4_;
        auVar89._8_4_ = fVar174 * auVar84._8_4_;
        auVar89._12_4_ = fVar175 * auVar84._12_4_;
        auVar109._0_4_ = fVar11 * auVar140._0_4_;
        auVar109._4_4_ = fVar12 * auVar140._4_4_;
        auVar109._8_4_ = fVar13 * auVar140._8_4_;
        auVar109._12_4_ = fVar14 * auVar140._12_4_;
        auVar151 = vfmsub213ps_fma(auVar140,auVar135,auVar89);
        auVar80 = vandps_avx(auVar51,local_3848);
        auVar140 = vandps_avx(auVar89,local_3848);
        auVar80 = vcmpps_avx(auVar80,auVar140,1);
        auVar140 = vblendvps_avx(auVar151,auVar149,auVar80);
        auVar52._0_4_ = auVar142._0_4_ * fVar158;
        auVar52._4_4_ = auVar142._4_4_ * fVar163;
        auVar52._8_4_ = auVar142._8_4_ * fVar164;
        auVar52._12_4_ = auVar142._12_4_ * fVar165;
        auVar149 = vfmsub213ps_fma(auVar142,auVar139,auVar109);
        auVar90._0_4_ = fVar170 * auVar159._0_4_;
        auVar90._4_4_ = fVar173 * auVar159._4_4_;
        auVar90._8_4_ = fVar174 * auVar159._8_4_;
        auVar90._12_4_ = fVar175 * auVar159._12_4_;
        auVar151 = vfmsub213ps_fma(auVar47,auVar122,auVar90);
        auVar80 = vandps_avx(auVar90,local_3848);
        auVar139 = vandps_avx(auVar109,local_3848);
        auVar80 = vcmpps_avx(auVar80,auVar139,1);
        auVar150 = ZEXT1664(local_3848);
        auVar149 = vblendvps_avx(auVar149,auVar151,auVar80);
        auVar151 = vfmsub213ps_fma(auVar159,auVar135,auVar68);
        auVar47 = vfmsub213ps_fma(auVar84,auVar122,auVar52);
        auVar80 = vandps_avx(local_3848,auVar68);
        auVar139 = vandps_avx(local_3848,auVar52);
        auVar80 = vcmpps_avx(auVar80,auVar139,1);
        auVar139 = vblendvps_avx(auVar47,auVar151,auVar80);
        local_3878 = auVar24._0_4_;
        fStack_3874 = auVar24._4_4_;
        fStack_3870 = auVar24._8_4_;
        auVar53._0_4_ = auVar139._0_4_ * local_3878;
        auVar53._4_4_ = auVar139._4_4_ * fStack_3874;
        auVar53._8_4_ = auVar139._8_4_ * fStack_3870;
        auVar53._12_4_ = auVar139._12_4_ * fVar18;
        auVar80 = vfmadd213ps_fma(auVar91,auVar149,auVar53);
        auVar80 = vfmadd213ps_fma(auVar92,auVar140,auVar80);
        auVar54._0_4_ = auVar80._0_4_ + auVar80._0_4_;
        auVar54._4_4_ = auVar80._4_4_ + auVar80._4_4_;
        auVar54._8_4_ = auVar80._8_4_ + auVar80._8_4_;
        auVar54._12_4_ = auVar80._12_4_ + auVar80._12_4_;
        auVar69._0_4_ = auVar139._0_4_ * fVar6;
        auVar69._4_4_ = auVar139._4_4_ * fVar7;
        auVar69._8_4_ = auVar139._8_4_ * fVar8;
        auVar69._12_4_ = auVar139._12_4_ * fVar9;
        auVar80 = vfmadd213ps_fma(auVar123,auVar149,auVar69);
        auVar91 = vfmadd213ps_fma(auVar76,auVar140,auVar80);
        auVar80 = vrcpps_avx(auVar54);
        auVar118._8_4_ = 0x3f800000;
        auVar118._0_8_ = &DAT_3f8000003f800000;
        auVar118._12_4_ = 0x3f800000;
        auVar92 = vfnmadd213ps_fma(auVar80,auVar54,auVar118);
        auVar80 = vfmadd132ps_fma(auVar92,auVar80,auVar80);
        auVar70._0_4_ = (auVar91._0_4_ + auVar91._0_4_) * auVar80._0_4_;
        auVar70._4_4_ = (auVar91._4_4_ + auVar91._4_4_) * auVar80._4_4_;
        auVar70._8_4_ = (auVar91._8_4_ + auVar91._8_4_) * auVar80._8_4_;
        auVar70._12_4_ = (auVar91._12_4_ + auVar91._12_4_) * auVar80._12_4_;
        auVar80 = *(undefined1 (*) [16])(ray + 0x80);
        auVar91 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar70,2);
        auVar92 = vcmpps_avx(auVar70,auVar80,2);
        auVar91 = vandps_avx(auVar91,auVar92);
        uVar25 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
        auVar110._0_8_ = uVar25 ^ 0x8000000080000000;
        auVar110._8_4_ = -auVar54._8_4_;
        auVar110._12_4_ = -auVar54._12_4_;
        auVar92 = vcmpps_avx(auVar54,auVar110,4);
        auVar82 = ZEXT1664(auVar105);
        auVar91 = vandps_avx(auVar92,auVar91);
        auVar75 = vandps_avx(auVar105,auVar75);
        auVar91 = vpslld_avx(auVar91,0x1f);
        auVar92 = vpsrad_avx(auVar91,0x1f);
        auVar91 = auVar75 & auVar92;
        if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar91[0xf]
           ) goto LAB_0062df39;
        auVar75 = vandps_avx(auVar92,auVar75);
        pGVar4 = (context->scene->geometries).items[uVar28].ptr;
        uVar3 = pGVar4->mask;
        auVar93._4_4_ = uVar3;
        auVar93._0_4_ = uVar3;
        auVar93._8_4_ = uVar3;
        auVar93._12_4_ = uVar3;
        auVar91 = vpand_avx(auVar93,*(undefined1 (*) [16])(ray + 0x90));
        auVar91 = vpcmpeqd_avx(auVar91,_DAT_01feba10);
        auVar92 = auVar75 & ~auVar91;
        auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar92[0xf] < '\0') {
          uVar2 = *(undefined4 *)((long)&local_3708 + uVar36 * 4);
          auVar75 = vandnps_avx(auVar91,auVar75);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar91 = vrcpps_avx(auVar87);
            auVar125._8_4_ = 0x3f800000;
            auVar125._0_8_ = &DAT_3f8000003f800000;
            auVar125._12_4_ = 0x3f800000;
            auVar92 = vfnmadd213ps_fma(auVar87,auVar91,auVar125);
            auVar91 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
            auVar61._8_4_ = 0x219392ef;
            auVar61._0_8_ = 0x219392ef219392ef;
            auVar61._12_4_ = 0x219392ef;
            auVar63 = vcmpps_avx(auVar63,auVar61,5);
            auVar63 = vandps_avx(auVar63,auVar91);
            auVar116._0_4_ = auVar63._0_4_ * auVar146._0_4_;
            auVar116._4_4_ = auVar63._4_4_ * auVar146._4_4_;
            auVar116._8_4_ = auVar63._8_4_ * auVar146._8_4_;
            auVar116._12_4_ = auVar63._12_4_ * auVar146._12_4_;
            auVar91 = vminps_avx(auVar116,auVar125);
            auVar62._0_4_ = auVar63._0_4_ * auVar153._0_4_;
            auVar62._4_4_ = auVar63._4_4_ * auVar153._4_4_;
            auVar62._8_4_ = auVar63._8_4_ * auVar153._8_4_;
            auVar62._12_4_ = auVar63._12_4_ * auVar153._12_4_;
            auVar63 = vminps_avx(auVar62,auVar125);
            auVar92 = vsubps_avx(auVar125,auVar91);
            auVar76 = vsubps_avx(auVar125,auVar63);
            auVar22._8_8_ = uVar27;
            auVar22._0_8_ = uVar26;
            local_36c8 = vblendvps_avx(auVar91,auVar92,auVar22);
            local_36b8 = vblendvps_avx(auVar63,auVar76,auVar22);
            local_3698._4_4_ = uVar28;
            local_3698._0_4_ = uVar28;
            local_3698._8_4_ = uVar28;
            local_3698._12_4_ = uVar28;
            local_36a8._4_4_ = uVar2;
            local_36a8._0_4_ = uVar2;
            local_36a8._8_4_ = uVar2;
            local_36a8._12_4_ = uVar2;
            local_36f8[0] = (RTCHitN)auVar140[0];
            local_36f8[1] = (RTCHitN)auVar140[1];
            local_36f8[2] = (RTCHitN)auVar140[2];
            local_36f8[3] = (RTCHitN)auVar140[3];
            local_36f8[4] = (RTCHitN)auVar140[4];
            local_36f8[5] = (RTCHitN)auVar140[5];
            local_36f8[6] = (RTCHitN)auVar140[6];
            local_36f8[7] = (RTCHitN)auVar140[7];
            local_36f8[8] = (RTCHitN)auVar140[8];
            local_36f8[9] = (RTCHitN)auVar140[9];
            local_36f8[10] = (RTCHitN)auVar140[10];
            local_36f8[0xb] = (RTCHitN)auVar140[0xb];
            local_36f8[0xc] = (RTCHitN)auVar140[0xc];
            local_36f8[0xd] = (RTCHitN)auVar140[0xd];
            local_36f8[0xe] = (RTCHitN)auVar140[0xe];
            local_36f8[0xf] = (RTCHitN)auVar140[0xf];
            local_36e8 = auVar149;
            local_36d8 = auVar139;
            vpcmpeqd_avx2(ZEXT1632(local_36b8),ZEXT1632(local_36b8));
            uStack_3684 = context->user->instID[0];
            local_3688 = uStack_3684;
            uStack_3680 = uStack_3684;
            uStack_367c = uStack_3684;
            uStack_3678 = context->user->instPrimID[0];
            uStack_3674 = uStack_3678;
            uStack_3670 = uStack_3678;
            uStack_366c = uStack_3678;
            auVar63 = vblendvps_avx(auVar80,auVar70,auVar75);
            *(undefined1 (*) [16])(ray + 0x80) = auVar63;
            args.valid = (int *)local_3868;
            args.geometryUserPtr = pGVar4->userPtr;
            args.context = context->user;
            args.hit = local_36f8;
            args.N = 4;
            local_3868 = auVar75;
            args.ray = (RTCRayN *)ray;
            if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar4->occlusionFilterN)(&args);
              auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            if (local_3868 == (undefined1  [16])0x0) {
              auVar63 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
              auVar63 = auVar63 ^ _DAT_01febe20;
            }
            else {
              p_Var5 = context->args->filter;
              auVar63 = vpcmpeqd_avx(local_3868,local_3868);
              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                auVar82._0_8_ = (*p_Var5)(&args);
                auVar82._8_56_ = extraout_var;
                auVar63 = vpcmpeqd_avx(auVar82._0_16_,auVar82._0_16_);
                auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              auVar75 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_3868);
              auVar63 = auVar75 ^ auVar63;
              auVar102._8_4_ = 0xff800000;
              auVar102._0_8_ = 0xff800000ff800000;
              auVar102._12_4_ = 0xff800000;
              auVar75 = vblendvps_avx(auVar102,*(undefined1 (*) [16])(args.ray + 0x80),auVar75);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar75;
            }
            auVar63 = vpslld_avx(auVar63,0x1f);
            auVar75 = vpsrad_avx(auVar63,0x1f);
            auVar63 = vblendvps_avx(auVar80,*(undefined1 (*) [16])pRVar1,auVar63);
            *(undefined1 (*) [16])pRVar1 = auVar63;
            auVar150 = ZEXT1664(local_3848);
          }
          auVar105 = vpandn_avx(auVar75,auVar105);
          auVar82 = ZEXT1664(auVar105);
        }
      }
      auVar105 = auVar82._0_16_;
      if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar105 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar105 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar82[0xf])
      {
        bVar39 = false;
      }
      else {
        auVar63 = *(undefined1 (*) [16])ray;
        auVar75 = *(undefined1 (*) [16])(ray + 0x10);
        auVar80 = *(undefined1 (*) [16])(ray + 0x20);
        auVar76 = vsubps_avx(local_37d8,auVar63);
        auVar123 = vsubps_avx(local_37e8,auVar75);
        auVar23._4_4_ = uVar32;
        auVar23._0_4_ = uVar32;
        auVar23._8_4_ = uVar32;
        auVar23._12_4_ = uVar32;
        auVar91 = vsubps_avx(auVar23,auVar80);
        auVar92 = vsubps_avx(auVar134,auVar63);
        auVar139 = vsubps_avx(auVar145,auVar75);
        auVar140 = vsubps_avx(auVar152,auVar80);
        auVar149 = vsubps_avx(auVar121,auVar63);
        auVar151 = vsubps_avx(_local_38b8,auVar75);
        auVar80 = vsubps_avx(auVar171,auVar80);
        auVar47 = vsubps_avx(auVar149,auVar76);
        auVar84 = vsubps_avx(auVar151,auVar123);
        auVar159 = vsubps_avx(auVar80,auVar91);
        auVar136._0_4_ = auVar149._0_4_ + auVar76._0_4_;
        auVar136._4_4_ = auVar149._4_4_ + auVar76._4_4_;
        auVar136._8_4_ = auVar149._8_4_ + auVar76._8_4_;
        auVar136._12_4_ = auVar149._12_4_ + auVar76._12_4_;
        auVar147._0_4_ = auVar123._0_4_ + auVar151._0_4_;
        auVar147._4_4_ = auVar123._4_4_ + auVar151._4_4_;
        auVar147._8_4_ = auVar123._8_4_ + auVar151._8_4_;
        auVar147._12_4_ = auVar123._12_4_ + auVar151._12_4_;
        fVar170 = auVar91._0_4_;
        auVar155._0_4_ = fVar170 + auVar80._0_4_;
        fVar173 = auVar91._4_4_;
        auVar155._4_4_ = fVar173 + auVar80._4_4_;
        fVar174 = auVar91._8_4_;
        auVar155._8_4_ = fVar174 + auVar80._8_4_;
        fVar175 = auVar91._12_4_;
        auVar155._12_4_ = fVar175 + auVar80._12_4_;
        auVar161._0_4_ = auVar147._0_4_ * auVar159._0_4_;
        auVar161._4_4_ = auVar147._4_4_ * auVar159._4_4_;
        auVar161._8_4_ = auVar147._8_4_ * auVar159._8_4_;
        auVar161._12_4_ = auVar147._12_4_ * auVar159._12_4_;
        auVar122 = vfmsub231ps_fma(auVar161,auVar84,auVar155);
        auVar156._0_4_ = auVar155._0_4_ * auVar47._0_4_;
        auVar156._4_4_ = auVar155._4_4_ * auVar47._4_4_;
        auVar156._8_4_ = auVar155._8_4_ * auVar47._8_4_;
        auVar156._12_4_ = auVar155._12_4_ * auVar47._12_4_;
        auVar75 = vfmsub231ps_fma(auVar156,auVar159,auVar136);
        auVar137._0_4_ = auVar136._0_4_ * auVar84._0_4_;
        auVar137._4_4_ = auVar136._4_4_ * auVar84._4_4_;
        auVar137._8_4_ = auVar136._8_4_ * auVar84._8_4_;
        auVar137._12_4_ = auVar136._12_4_ * auVar84._12_4_;
        auVar63 = vfmsub231ps_fma(auVar137,auVar47,auVar147);
        fVar15 = *(float *)(ray + 0x60);
        fVar16 = *(float *)(ray + 100);
        fVar17 = *(float *)(ray + 0x68);
        auVar24 = *(undefined1 (*) [12])(ray + 0x60);
        fVar18 = *(float *)(ray + 0x6c);
        auVar144._0_4_ = auVar63._0_4_ * fVar15;
        auVar144._4_4_ = auVar63._4_4_ * fVar16;
        auVar144._8_4_ = auVar63._8_4_ * fVar17;
        auVar144._12_4_ = auVar63._12_4_ * fVar18;
        auVar63 = *(undefined1 (*) [16])(ray + 0x50);
        auVar135 = vfmadd231ps_fma(auVar144,auVar63,auVar75);
        auVar75 = *(undefined1 (*) [16])(ray + 0x40);
        auVar153 = vfmadd231ps_fma(auVar135,auVar75,auVar122);
        auVar135 = vsubps_avx(auVar123,auVar139);
        auVar122 = vsubps_avx(auVar91,auVar140);
        auVar138._0_4_ = auVar123._0_4_ + auVar139._0_4_;
        auVar138._4_4_ = auVar123._4_4_ + auVar139._4_4_;
        auVar138._8_4_ = auVar123._8_4_ + auVar139._8_4_;
        auVar138._12_4_ = auVar123._12_4_ + auVar139._12_4_;
        auVar94._0_4_ = fVar170 + auVar140._0_4_;
        auVar94._4_4_ = fVar173 + auVar140._4_4_;
        auVar94._8_4_ = fVar174 + auVar140._8_4_;
        auVar94._12_4_ = fVar175 + auVar140._12_4_;
        fVar6 = auVar122._0_4_;
        auVar111._0_4_ = auVar138._0_4_ * fVar6;
        fVar8 = auVar122._4_4_;
        auVar111._4_4_ = auVar138._4_4_ * fVar8;
        fVar11 = auVar122._8_4_;
        auVar111._8_4_ = auVar138._8_4_ * fVar11;
        fVar13 = auVar122._12_4_;
        auVar111._12_4_ = auVar138._12_4_ * fVar13;
        auVar146 = vfmsub231ps_fma(auVar111,auVar135,auVar94);
        auVar142 = vsubps_avx(auVar76,auVar92);
        fVar158 = auVar142._0_4_;
        auVar95._0_4_ = fVar158 * auVar94._0_4_;
        fVar163 = auVar142._4_4_;
        auVar95._4_4_ = fVar163 * auVar94._4_4_;
        fVar164 = auVar142._8_4_;
        auVar95._8_4_ = fVar164 * auVar94._8_4_;
        fVar165 = auVar142._12_4_;
        auVar95._12_4_ = fVar165 * auVar94._12_4_;
        auVar131._0_4_ = auVar76._0_4_ + auVar92._0_4_;
        auVar131._4_4_ = auVar76._4_4_ + auVar92._4_4_;
        auVar131._8_4_ = auVar76._8_4_ + auVar92._8_4_;
        auVar131._12_4_ = auVar76._12_4_ + auVar92._12_4_;
        auVar91 = vfmsub231ps_fma(auVar95,auVar122,auVar131);
        fVar7 = auVar135._0_4_;
        auVar132._0_4_ = auVar131._0_4_ * fVar7;
        fVar9 = auVar135._4_4_;
        auVar132._4_4_ = auVar131._4_4_ * fVar9;
        fVar12 = auVar135._8_4_;
        auVar132._8_4_ = auVar131._8_4_ * fVar12;
        fVar14 = auVar135._12_4_;
        auVar132._12_4_ = auVar131._12_4_ * fVar14;
        auVar48 = vfmsub231ps_fma(auVar132,auVar142,auVar138);
        auVar133._0_4_ = fVar15 * auVar48._0_4_;
        auVar133._4_4_ = fVar16 * auVar48._4_4_;
        auVar133._8_4_ = fVar17 * auVar48._8_4_;
        auVar133._12_4_ = fVar18 * auVar48._12_4_;
        auVar91 = vfmadd231ps_fma(auVar133,auVar63,auVar91);
        auVar48 = vfmadd231ps_fma(auVar91,auVar75,auVar146);
        auVar146 = vsubps_avx(auVar92,auVar149);
        auVar96._0_4_ = auVar92._0_4_ + auVar149._0_4_;
        auVar96._4_4_ = auVar92._4_4_ + auVar149._4_4_;
        auVar96._8_4_ = auVar92._8_4_ + auVar149._8_4_;
        auVar96._12_4_ = auVar92._12_4_ + auVar149._12_4_;
        auVar149 = vsubps_avx(auVar139,auVar151);
        auVar71._0_4_ = auVar139._0_4_ + auVar151._0_4_;
        auVar71._4_4_ = auVar139._4_4_ + auVar151._4_4_;
        auVar71._8_4_ = auVar139._8_4_ + auVar151._8_4_;
        auVar71._12_4_ = auVar139._12_4_ + auVar151._12_4_;
        auVar139 = vsubps_avx(auVar140,auVar80);
        auVar55._0_4_ = auVar140._0_4_ + auVar80._0_4_;
        auVar55._4_4_ = auVar140._4_4_ + auVar80._4_4_;
        auVar55._8_4_ = auVar140._8_4_ + auVar80._8_4_;
        auVar55._12_4_ = auVar140._12_4_ + auVar80._12_4_;
        auVar112._0_4_ = auVar139._0_4_ * auVar71._0_4_;
        auVar112._4_4_ = auVar139._4_4_ * auVar71._4_4_;
        auVar112._8_4_ = auVar139._8_4_ * auVar71._8_4_;
        auVar112._12_4_ = auVar139._12_4_ * auVar71._12_4_;
        auVar91 = vfmsub231ps_fma(auVar112,auVar149,auVar55);
        auVar56._0_4_ = auVar146._0_4_ * auVar55._0_4_;
        auVar56._4_4_ = auVar146._4_4_ * auVar55._4_4_;
        auVar56._8_4_ = auVar146._8_4_ * auVar55._8_4_;
        auVar56._12_4_ = auVar146._12_4_ * auVar55._12_4_;
        auVar80 = vfmsub231ps_fma(auVar56,auVar139,auVar96);
        auVar97._0_4_ = auVar96._0_4_ * auVar149._0_4_;
        auVar97._4_4_ = auVar96._4_4_ * auVar149._4_4_;
        auVar97._8_4_ = auVar96._8_4_ * auVar149._8_4_;
        auVar97._12_4_ = auVar96._12_4_ * auVar149._12_4_;
        auVar92 = vfmsub231ps_fma(auVar97,auVar146,auVar71);
        auVar72._0_4_ = fVar15 * auVar92._0_4_;
        auVar72._4_4_ = fVar16 * auVar92._4_4_;
        auVar72._8_4_ = fVar17 * auVar92._8_4_;
        auVar72._12_4_ = fVar18 * auVar92._12_4_;
        auVar80 = vfmadd231ps_fma(auVar72,auVar63,auVar80);
        auVar140 = vfmadd231ps_fma(auVar80,auVar75,auVar91);
        auVar172._0_4_ = auVar140._0_4_ + auVar153._0_4_ + auVar48._0_4_;
        auVar172._4_4_ = auVar140._4_4_ + auVar153._4_4_ + auVar48._4_4_;
        auVar172._8_4_ = auVar140._8_4_ + auVar153._8_4_ + auVar48._8_4_;
        auVar172._12_4_ = auVar140._12_4_ + auVar153._12_4_ + auVar48._12_4_;
        auVar80 = vminps_avx(auVar153,auVar48);
        auVar91 = vminps_avx(auVar80,auVar140);
        auVar80 = vandps_avx(auVar172,local_3848);
        auVar98._0_4_ = auVar80._0_4_ * 1.1920929e-07;
        auVar98._4_4_ = auVar80._4_4_ * 1.1920929e-07;
        auVar98._8_4_ = auVar80._8_4_ * 1.1920929e-07;
        auVar98._12_4_ = auVar80._12_4_ * 1.1920929e-07;
        uVar25 = CONCAT44(auVar98._4_4_,auVar98._0_4_);
        auVar113._0_8_ = uVar25 ^ 0x8000000080000000;
        auVar113._8_4_ = -auVar98._8_4_;
        auVar113._12_4_ = -auVar98._12_4_;
        auVar91 = vcmpps_avx(auVar91,auVar113,5);
        auVar92 = vmaxps_avx(auVar153,auVar48);
        auVar92 = vmaxps_avx(auVar92,auVar140);
        auVar92 = vcmpps_avx(auVar92,auVar98,2);
        auVar91 = vorps_avx(auVar91,auVar92);
        auVar92 = auVar105 & auVar91;
        if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar92 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar92 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar92[0xf]
           ) {
LAB_0062df94:
          auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar57._0_4_ = fVar7 * auVar159._0_4_;
          auVar57._4_4_ = fVar9 * auVar159._4_4_;
          auVar57._8_4_ = fVar12 * auVar159._8_4_;
          auVar57._12_4_ = fVar14 * auVar159._12_4_;
          auVar73._0_4_ = fVar158 * auVar84._0_4_;
          auVar73._4_4_ = fVar163 * auVar84._4_4_;
          auVar73._8_4_ = fVar164 * auVar84._8_4_;
          auVar73._12_4_ = fVar165 * auVar84._12_4_;
          auVar140 = vfmsub213ps_fma(auVar84,auVar122,auVar57);
          auVar99._0_4_ = fVar6 * auVar149._0_4_;
          auVar99._4_4_ = fVar8 * auVar149._4_4_;
          auVar99._8_4_ = fVar11 * auVar149._8_4_;
          auVar99._12_4_ = fVar13 * auVar149._12_4_;
          auVar114._0_4_ = fVar158 * auVar139._0_4_;
          auVar114._4_4_ = fVar163 * auVar139._4_4_;
          auVar114._8_4_ = fVar164 * auVar139._8_4_;
          auVar114._12_4_ = fVar165 * auVar139._12_4_;
          auVar151 = vfmsub213ps_fma(auVar139,auVar135,auVar99);
          auVar92 = vandps_avx(auVar57,local_3848);
          auVar139 = vandps_avx(auVar99,local_3848);
          auVar92 = vcmpps_avx(auVar92,auVar139,1);
          auVar140 = vblendvps_avx(auVar151,auVar140,auVar92);
          auVar58._0_4_ = auVar146._0_4_ * fVar7;
          auVar58._4_4_ = auVar146._4_4_ * fVar9;
          auVar58._8_4_ = auVar146._8_4_ * fVar12;
          auVar58._12_4_ = auVar146._12_4_ * fVar14;
          auVar151 = vfmsub213ps_fma(auVar146,auVar122,auVar114);
          auVar100._0_4_ = auVar47._0_4_ * fVar6;
          auVar100._4_4_ = auVar47._4_4_ * fVar8;
          auVar100._8_4_ = auVar47._8_4_ * fVar11;
          auVar100._12_4_ = auVar47._12_4_ * fVar13;
          auVar84 = vfmsub213ps_fma(auVar159,auVar142,auVar100);
          auVar92 = vandps_avx(auVar100,local_3848);
          auVar139 = vandps_avx(auVar114,local_3848);
          auVar92 = vcmpps_avx(auVar92,auVar139,1);
          auVar151 = vblendvps_avx(auVar151,auVar84,auVar92);
          auVar47 = vfmsub213ps_fma(auVar47,auVar135,auVar73);
          auVar149 = vfmsub213ps_fma(auVar149,auVar142,auVar58);
          auVar92 = vandps_avx(auVar73,local_3848);
          auVar139 = vandps_avx(auVar58,local_3848);
          auVar92 = vcmpps_avx(auVar92,auVar139,1);
          auVar92 = vblendvps_avx(auVar149,auVar47,auVar92);
          local_38b8._0_4_ = auVar24._0_4_;
          local_38b8._4_4_ = auVar24._4_4_;
          fStack_38b0 = auVar24._8_4_;
          auVar59._0_4_ = auVar92._0_4_ * (float)local_38b8._0_4_;
          auVar59._4_4_ = auVar92._4_4_ * (float)local_38b8._4_4_;
          auVar59._8_4_ = auVar92._8_4_ * fStack_38b0;
          auVar59._12_4_ = auVar92._12_4_ * fVar18;
          auVar63 = vfmadd213ps_fma(auVar63,auVar151,auVar59);
          auVar63 = vfmadd213ps_fma(auVar75,auVar140,auVar63);
          auVar60._0_4_ = auVar63._0_4_ + auVar63._0_4_;
          auVar60._4_4_ = auVar63._4_4_ + auVar63._4_4_;
          auVar60._8_4_ = auVar63._8_4_ + auVar63._8_4_;
          auVar60._12_4_ = auVar63._12_4_ + auVar63._12_4_;
          auVar74._0_4_ = auVar92._0_4_ * fVar170;
          auVar74._4_4_ = auVar92._4_4_ * fVar173;
          auVar74._8_4_ = auVar92._8_4_ * fVar174;
          auVar74._12_4_ = auVar92._12_4_ * fVar175;
          auVar63 = vfmadd213ps_fma(auVar123,auVar151,auVar74);
          auVar75 = vfmadd213ps_fma(auVar76,auVar140,auVar63);
          auVar63 = vrcpps_avx(auVar60);
          auVar119._8_4_ = 0x3f800000;
          auVar119._0_8_ = &DAT_3f8000003f800000;
          auVar119._12_4_ = 0x3f800000;
          auVar76 = vfnmadd213ps_fma(auVar63,auVar60,auVar119);
          auVar63 = vfmadd132ps_fma(auVar76,auVar63,auVar63);
          auVar101._0_4_ = (auVar75._0_4_ + auVar75._0_4_) * auVar63._0_4_;
          auVar101._4_4_ = (auVar75._4_4_ + auVar75._4_4_) * auVar63._4_4_;
          auVar101._8_4_ = (auVar75._8_4_ + auVar75._8_4_) * auVar63._8_4_;
          auVar101._12_4_ = (auVar75._12_4_ + auVar75._12_4_) * auVar63._12_4_;
          auVar63 = *(undefined1 (*) [16])(ray + 0x80);
          auVar75 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar101,2);
          auVar76 = vcmpps_avx(auVar101,auVar63,2);
          auVar75 = vandps_avx(auVar75,auVar76);
          uVar25 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
          auVar115._0_8_ = uVar25 ^ 0x8000000080000000;
          auVar115._8_4_ = -auVar60._8_4_;
          auVar115._12_4_ = -auVar60._12_4_;
          auVar76 = vcmpps_avx(auVar60,auVar115,4);
          auVar75 = vandps_avx(auVar76,auVar75);
          auVar91 = vandps_avx(auVar105,auVar91);
          auVar75 = vpslld_avx(auVar75,0x1f);
          auVar76 = vpsrad_avx(auVar75,0x1f);
          auVar75 = auVar91 & auVar76;
          if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar75[0xf]) goto LAB_0062df94;
          auVar75 = vandps_avx(auVar76,auVar91);
          uVar3 = *(uint *)(lVar33 + uVar36 * 4);
          pGVar4 = (context->scene->geometries).items[uVar3].ptr;
          uVar28 = pGVar4->mask;
          auVar77._4_4_ = uVar28;
          auVar77._0_4_ = uVar28;
          auVar77._8_4_ = uVar28;
          auVar77._12_4_ = uVar28;
          auVar91 = vpand_avx(auVar77,*(undefined1 (*) [16])(ray + 0x90));
          auVar91 = vpcmpeqd_avx(auVar91,_DAT_01feba10);
          auVar76 = auVar75 & ~auVar91;
          auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar76[0xf] < '\0') {
            uVar32 = *(undefined4 *)((long)&local_3708 + uVar36 * 4);
            auVar75 = vandnps_avx(auVar91,auVar75);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar91 = vrcpps_avx(auVar172);
              auVar126._8_4_ = 0x3f800000;
              auVar126._0_8_ = &DAT_3f8000003f800000;
              auVar126._12_4_ = 0x3f800000;
              auVar76 = vfnmadd213ps_fma(auVar172,auVar91,auVar126);
              auVar91 = vfmadd132ps_fma(auVar76,auVar91,auVar91);
              auVar78._8_4_ = 0x219392ef;
              auVar78._0_8_ = 0x219392ef219392ef;
              auVar78._12_4_ = 0x219392ef;
              auVar80 = vcmpps_avx(auVar80,auVar78,5);
              auVar80 = vandps_avx(auVar80,auVar91);
              auVar117._0_4_ = auVar80._0_4_ * auVar153._0_4_;
              auVar117._4_4_ = auVar80._4_4_ * auVar153._4_4_;
              auVar117._8_4_ = auVar80._8_4_ * auVar153._8_4_;
              auVar117._12_4_ = auVar80._12_4_ * auVar153._12_4_;
              auVar91 = vminps_avx(auVar117,auVar126);
              auVar79._0_4_ = auVar80._0_4_ * auVar48._0_4_;
              auVar79._4_4_ = auVar80._4_4_ * auVar48._4_4_;
              auVar79._8_4_ = auVar80._8_4_ * auVar48._8_4_;
              auVar79._12_4_ = auVar80._12_4_ * auVar48._12_4_;
              auVar80 = vminps_avx(auVar79,auVar126);
              auVar76 = vsubps_avx(auVar126,auVar91);
              auVar123 = vsubps_avx(auVar126,auVar80);
              local_36c8 = vblendvps_avx(auVar91,auVar76,auVar10);
              local_36b8 = vblendvps_avx(auVar80,auVar123,auVar10);
              local_3698._4_4_ = uVar3;
              local_3698._0_4_ = uVar3;
              local_3698._8_4_ = uVar3;
              local_3698._12_4_ = uVar3;
              local_36a8._4_4_ = uVar32;
              local_36a8._0_4_ = uVar32;
              local_36a8._8_4_ = uVar32;
              local_36a8._12_4_ = uVar32;
              local_36f8[0] = (RTCHitN)auVar140[0];
              local_36f8[1] = (RTCHitN)auVar140[1];
              local_36f8[2] = (RTCHitN)auVar140[2];
              local_36f8[3] = (RTCHitN)auVar140[3];
              local_36f8[4] = (RTCHitN)auVar140[4];
              local_36f8[5] = (RTCHitN)auVar140[5];
              local_36f8[6] = (RTCHitN)auVar140[6];
              local_36f8[7] = (RTCHitN)auVar140[7];
              local_36f8[8] = (RTCHitN)auVar140[8];
              local_36f8[9] = (RTCHitN)auVar140[9];
              local_36f8[10] = (RTCHitN)auVar140[10];
              local_36f8[0xb] = (RTCHitN)auVar140[0xb];
              local_36f8[0xc] = (RTCHitN)auVar140[0xc];
              local_36f8[0xd] = (RTCHitN)auVar140[0xd];
              local_36f8[0xe] = (RTCHitN)auVar140[0xe];
              local_36f8[0xf] = (RTCHitN)auVar140[0xf];
              local_36e8 = auVar151;
              local_36d8 = auVar92;
              vpcmpeqd_avx2(ZEXT1632(local_36b8),ZEXT1632(local_36b8));
              uStack_3684 = context->user->instID[0];
              local_3688 = uStack_3684;
              uStack_3680 = uStack_3684;
              uStack_367c = uStack_3684;
              uStack_3678 = context->user->instPrimID[0];
              uStack_3674 = uStack_3678;
              uStack_3670 = uStack_3678;
              uStack_366c = uStack_3678;
              auVar80 = vblendvps_avx(auVar63,auVar101,auVar75);
              *(undefined1 (*) [16])(ray + 0x80) = auVar80;
              args.valid = (int *)local_3868;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = local_36f8;
              args.N = 4;
              local_3868 = auVar75;
              args.ray = (RTCRayN *)ray;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
                auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              if (local_3868 == (undefined1  [16])0x0) {
                auVar75 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar75 = auVar75 ^ _DAT_01febe20;
              }
              else {
                p_Var5 = context->args->filter;
                auVar75 = vpcmpeqd_avx(local_3868,local_3868);
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar150._0_8_ = (*p_Var5)(&args);
                  auVar150._8_56_ = extraout_var_00;
                  auVar75 = vpcmpeqd_avx(auVar150._0_16_,auVar150._0_16_);
                  auVar162 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar148 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar157 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                auVar80 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_3868);
                auVar75 = auVar80 ^ auVar75;
                auVar103._8_4_ = 0xff800000;
                auVar103._0_8_ = 0xff800000ff800000;
                auVar103._12_4_ = 0xff800000;
                auVar80 = vblendvps_avx(auVar103,*(undefined1 (*) [16])(args.ray + 0x80),auVar80);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar80;
              }
              auVar80 = vpslld_avx(auVar75,0x1f);
              auVar75 = vpsrad_avx(auVar80,0x1f);
              auVar63 = vblendvps_avx(auVar63,*(undefined1 (*) [16])pRVar1,auVar80);
              *(undefined1 (*) [16])pRVar1 = auVar63;
            }
            auVar105 = vpandn_avx(auVar75,auVar105);
          }
        }
        auVar82 = ZEXT1664(auVar105);
        auVar150 = ZEXT1664(local_3848);
        bVar39 = (((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 auVar105[0xf] < '\0';
      }
      auVar105 = auVar82._0_16_;
      if ((!bVar39) || (bVar39 = 2 < uVar36, uVar36 = uVar36 + 1, bVar39)) break;
    }
    auVar80 = vandps_avx(auVar105,local_3858);
    auVar105 = local_3858 & auVar105;
    auVar63 = local_3858;
    if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar105 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar105 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar105[0xf])
    break;
  }
  auVar105 = vpcmpeqd_avx(auVar63,auVar63);
  aVar64._0_4_ = auVar80._0_4_ ^ auVar105._0_4_;
  aVar64._4_4_ = auVar80._4_4_ ^ auVar105._4_4_;
  aVar64._8_4_ = auVar80._8_4_ ^ auVar105._8_4_;
  aVar64._12_4_ = auVar80._12_4_ ^ auVar105._12_4_;
LAB_0062e02c:
  auVar82 = ZEXT1664(auVar105);
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])aVar64,(undefined1  [16])terminated.field_0);
  auVar105 = auVar105 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar105 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar105 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar105[0xf]) {
LAB_0062e06f:
    iVar29 = 3;
  }
  else {
    auVar82 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
    auVar104._8_4_ = 0xff800000;
    auVar104._0_8_ = 0xff800000ff800000;
    auVar104._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar104,
                       (undefined1  [16])terminated.field_0);
    iVar29 = 0;
  }
LAB_0062e072:
  if (iVar29 == 3) {
    auVar10 = vandps_avx(auVar81,(undefined1  [16])terminated.field_0);
    auVar81._8_4_ = 0xff800000;
    auVar81._0_8_ = 0xff800000ff800000;
    auVar81._12_4_ = 0xff800000;
    auVar10 = vmaskmovps_avx(auVar10,auVar81);
    *(undefined1 (*) [16])pRVar1 = auVar10;
    return;
  }
  goto LAB_0062ce3d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }